

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void setContentAreaOpaque(_GLFWwindow *window)

{
  wl_region *wl_region;
  int32_t in_ECX;
  int32_t in_R8D;
  
  wl_region = wl_compositor_create_region(_glfw.wl.compositor);
  if (wl_region != (wl_region *)0x0) {
    wl_region_add(wl_region,(window->wl).width,(window->wl).height,in_ECX,in_R8D);
    wl_surface_set_opaque_region((window->wl).surface,wl_region);
    wl_region_destroy(wl_region);
    return;
  }
  return;
}

Assistant:

static void setContentAreaOpaque(_GLFWwindow* window)
{
    struct wl_region* region;

    region = wl_compositor_create_region(_glfw.wl.compositor);
    if (!region)
        return;

    wl_region_add(region, 0, 0, window->wl.width, window->wl.height);
    wl_surface_set_opaque_region(window->wl.surface, region);
    wl_region_destroy(region);
}